

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memleak.cc
# Opt level: O0

void memleak_end(void)

{
  avl_node *paVar1;
  memleak_item *item;
  avl_node *a;
  size_t count;
  uint8_t is_leaked;
  avl_node *local_18;
  ulong local_10;
  
  local_10 = 0;
  pthread_spin_lock(&lock);
  start_sw = '\0';
  local_18 = avl_first(&tree_index);
  while (local_18 != (avl_node *)0x0) {
    paVar1 = avl_next(local_18);
    avl_remove((avl_tree *)a,(avl_node *)item);
    fprintf(_stderr,"address 0x%016lx (allocated at %s:%lu, size %lu) is not freed\n",
            local_18[-2].right,local_18[-1].parent,local_18[-1].right,local_18[-1].left);
    local_10 = local_10 + 1;
    free(&local_18[-2].right);
    local_18 = paVar1;
  }
  if (local_10 != 0) {
    fprintf(_stderr,"total %d objects\n",local_10 & 0xffffffff);
  }
  pthread_spin_unlock(&lock);
  return;
}

Assistant:

LIBMEMLEAK_API
void memleak_end()
{
    uint8_t is_leaked;
    size_t count = 0;
    struct avl_node *a;
    struct memleak_item *item;
#ifdef _STACK_BACKTRACE
    int i;
    char **strs;
    char *file, *func;
    unsigned line;
#endif

    spin_lock(&lock);

    start_sw = 0;

    a = avl_first(&tree_index);
    while(a){
        item = _get_entry(a, struct memleak_item, avl);
        a = avl_next(a);
        avl_remove(&tree_index, &item->avl);
        is_leaked = 1;

#ifdef _CHK_MODIFY_AFTER_FREE
        int i;
        uint8_t *addr;
        if (item->freed) {
            is_leaked = 0;
            addr = (uint8_t*)item->addr;
            for (i=0;i<item->size;++i){
                if (*(addr + i) != FREE_VAL) {
                    fprintf(stderr,
                            "address 0x%016lx (allocated at %s:%lu, size %lu) "
                            "has been modified after being freed\n",
                            (unsigned long)item->addr, item->file,
                            item->line, item->size);
                    break;
                }
            }
            free(addr);
        }
#endif // _CHK_MODIFY_AFTER_FREE

        if (is_leaked) {
            fprintf(stderr, "address 0x%016lx (allocated at %s:%lu, size %lu) "
                            "is not freed\n",
                    (unsigned long)item->addr, item->file,
                    (unsigned long)item->line, (unsigned long)item->size);
            count++;
#ifdef _STACK_BACKTRACE
            strs = backtrace_symbols(item->btrace, item->bt_size);
            for (i=0;i<item->bt_size;++i){
#ifdef _LIBBFD
                resolve(item->btrace[i], &file, &func, &line);
                fprintf(stderr, "    %s [%s:%d]\n", func, file, line);
#else // _LIBBFD
                fprintf(stderr, "    %s\n", strs[i]);
#endif // _LIBBFD
            }
            free(item->btrace);
#endif // _STACK_BACKTRACE
        }
        free(item);
    }
    if (count > 0) fprintf(stderr, "total %d objects\n", (int)count);

    spin_unlock(&lock);
}